

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::reopen_listen_sockets(session_impl *this,bool map_ports)

{
  pointer *this_00;
  span<const_libtorrent::aux::ip_route> routes_00;
  undefined4 p;
  bool bVar1;
  int iVar2;
  long lVar3;
  reference pvVar4;
  reference this_01;
  reference psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  element_type *this_02;
  element_type *this_03;
  element_type *this_04;
  size_type sVar8;
  iterator iVar9;
  iterator iVar10;
  element_type *peVar11;
  reference pvVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *peVar15;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var16;
  element_type *peVar17;
  shared_ptr<libtorrent::aux::listen_socket_t> *psVar18;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_05;
  element_type *this_06;
  endpoint *ep_00;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  *__rhs;
  listen_socket_handle *s_00;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *this_07;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  *in_R9;
  span<const_libtorrent::aux::ip_interface> ifs_00;
  span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> sVar19;
  span<const_libtorrent::aux::ip_interface> ifs_01;
  byte local_4c1;
  byte local_471;
  int local_430;
  shared_ptr<libtorrent::aux::torrent> *t;
  iterator __end2_1;
  iterator __begin2_1;
  torrent_list<libtorrent::aux::torrent> *__range2_1;
  shared_ptr<libtorrent::aux::listen_socket_t> *s_4;
  shared_ptr<libtorrent::aux::listen_socket_t> *__end3_5;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3_5;
  span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *__range3_5;
  shared_ptr<libtorrent::aux::listen_socket_t> *s_3;
  iterator __end3_4;
  iterator __begin3_4;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range3_4;
  shared_ptr<libtorrent::aux::listen_socket_t> *s_2;
  shared_ptr<libtorrent::aux::listen_socket_t> *__end3_3;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3_3;
  span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *__range3_3;
  shared_ptr<libtorrent::aux::listen_socket_t> *s_1;
  shared_ptr<libtorrent::aux::listen_socket_t> *__end3_2;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3_2;
  span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *__range3_2;
  socket_type_t socket_type_1;
  endpoint udp_ep;
  socket_type_t socket_type;
  endpoint tcp_ep;
  error_code err;
  shared_ptr<libtorrent::aux::listen_socket_t> *l;
  shared_ptr<libtorrent::aux::listen_socket_t> *__end3_1;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3_1;
  span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *__range3_1;
  undefined1 local_2f8 [8];
  span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> new_sockets;
  exception *e;
  listen_socket_handle local_2a8;
  undefined1 local_293;
  uchar local_292;
  bitfield_flag local_291;
  undefined1 local_290 [8];
  shared_ptr<libtorrent::aux::listen_socket_t> s;
  listen_endpoint_t *ep_1;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  *__range2;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>const*,std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>>
  a_Stack_240 [4];
  int existing_sockets;
  undefined8 local_238;
  string local_230;
  shared_ptr<libtorrent::aux::listen_socket_t> local_210;
  listen_socket_handle local_200;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_1f0;
  undefined1 local_1e8 [16];
  iterator remove_iter;
  ip_interface *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1c8;
  span<const_libtorrent::aux::ip_interface> local_1b8;
  span<libtorrent::aux::ip_interface_const> local_1a8 [23];
  byte local_191;
  reference local_190;
  listen_interface_t *iface;
  iterator __end3;
  iterator __begin3;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *__range3;
  undefined1 local_168 [8];
  vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> routes;
  undefined1 local_148 [8];
  vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_> ifs;
  string local_108;
  address_v4 local_e4;
  address local_e0;
  undefined1 local_c0 [8];
  listen_endpoint_t ep;
  int port;
  undefined1 local_40 [8];
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  eps;
  error_code ec;
  bool map_ports_local;
  session_impl *this_local;
  
  session_log(this,"reopen listen sockets");
  boost::system::error_code::error_code
            ((error_code *)
             &eps.
              super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((this->m_abort & 1U) == 0) {
    ::std::
    vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
    ::vector((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
              *)local_40);
    iVar2 = session_settings::get_int(&this->m_settings,0x407b);
    if ((iVar2 == 0) || (bVar1 = session_settings::get_bool(&this->m_settings,0x8041), !bVar1)) {
      enum_net_interfaces((vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                           *)local_148,this->m_io_context,
                          (error_code *)
                          &eps.
                           super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = boost::system::error_code::operator_cast_to_bool
                        ((error_code *)
                         &eps.
                          super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar1) &&
         (bVar1 = alert_manager::should_post<libtorrent::listen_failed_alert>(&this->m_alerts),
         bVar1)) {
        routes.
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x17;
        routes.
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        alert_manager::
        emplace_alert<libtorrent::listen_failed_alert,char_const(&)[1],libtorrent::operation_t,boost::system::error_code&,libtorrent::socket_type_t>
                  (&this->m_alerts,(char (*) [1])0x86a1ad,
                   (operation_t *)
                   ((long)&routes.
                           super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                   (error_code *)
                   &eps.
                    super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (socket_type_t *)
                   ((long)&routes.
                           super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      }
      enum_routes((vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> *)
                  local_168,this->m_io_context,
                  (error_code *)
                  &eps.
                   super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = boost::system::error_code::operator_cast_to_bool
                        ((error_code *)
                         &eps.
                          super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar1) &&
         (bVar1 = alert_manager::should_post<libtorrent::listen_failed_alert>(&this->m_alerts),
         bVar1)) {
        __range3._7_1_ = 0x2a;
        __range3._6_1_ = 0;
        alert_manager::
        emplace_alert<libtorrent::listen_failed_alert,char_const(&)[1],libtorrent::operation_t,boost::system::error_code&,libtorrent::socket_type_t>
                  (&this->m_alerts,(char (*) [1])0x86a1ad,(operation_t *)((long)&__range3 + 7),
                   (error_code *)
                   &eps.
                    super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (socket_type_t *)((long)&__range3 + 6));
      }
      __end3 = ::std::
               vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
               ::begin(&this->m_listen_interfaces);
      iface = (listen_interface_t *)
              ::std::
              vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
              ::end(&this->m_listen_interfaces);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<libtorrent::aux::listen_interface_t_*,_std::vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>_>
                                         *)&iface), bVar1) {
        this_01 = __gnu_cxx::
                  __normal_iterator<libtorrent::aux::listen_interface_t_*,_std::vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>_>
                  ::operator*(&__end3);
        local_191 = 1;
        local_190 = this_01;
        span<libtorrent::aux::ip_interface_const>::
        span<std::vector<libtorrent::aux::ip_interface,std::allocator<libtorrent::aux::ip_interface>>,libtorrent::aux::ip_interface,void>
                  (local_1a8,
                   (vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                    *)local_148);
        ifs_01.m_len = (difference_type)local_40;
        ifs_01.m_ptr = (ip_interface *)local_1a8._8_8_;
        interface_to_endpoints
                  ((aux *)this_01,(listen_interface_t *)(ulong)local_191,
                   (listen_socket_flags_t)(uchar)local_1a8._0_8_,ifs_01,in_R9);
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::listen_interface_t_*,_std::vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>_>
        ::operator++(&__end3);
      }
      bVar1 = ::std::
              vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
              ::empty((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                       *)local_40);
      if (bVar1) {
        session_log(this,"no listen sockets");
      }
      span<libtorrent::aux::ip_interface_const>::
      span<std::vector<libtorrent::aux::ip_interface,std::allocator<libtorrent::aux::ip_interface>>,libtorrent::aux::ip_interface,void>
                ((span<libtorrent::aux::ip_interface_const> *)&local_1b8,
                 (vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                  *)local_148);
      span<libtorrent::aux::ip_route_const>::
      span<std::vector<libtorrent::aux::ip_route,std::allocator<libtorrent::aux::ip_route>>,libtorrent::aux::ip_route,void>
                ((span<libtorrent::aux::ip_route_const> *)local_1c8._M_local_buf,
                 (vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> *)
                 local_168);
      routes_00.m_len = local_1c8._8_8_;
      routes_00.m_ptr = (ip_route *)local_1c8._M_allocated_capacity;
      expand_unspecified_address
                (local_1b8,routes_00,
                 (vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                  *)local_40);
      span<libtorrent::aux::ip_interface_const>::
      span<std::vector<libtorrent::aux::ip_interface,std::allocator<libtorrent::aux::ip_interface>>,libtorrent::aux::ip_interface,void>
                ((span<libtorrent::aux::ip_interface_const> *)&remove_iter,
                 (vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                  *)local_148);
      ifs_00.m_len = (difference_type)local_40;
      ifs_00.m_ptr = local_1d0;
      expand_devices((aux *)remove_iter._M_current,ifs_00,
                     (vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                      *)local_1c8._8_8_);
      ::std::vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>::~vector
                ((vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> *)
                 local_168);
      ::std::vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>::
      ~vector((vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
               *)local_148);
    }
    else {
      bVar1 = ::std::
              vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
              ::empty(&this->m_listen_interfaces);
      if (bVar1) {
        lVar3 = random((aux *)0xf618);
        local_430 = (int)lVar3 + 2000;
      }
      else {
        pvVar4 = ::std::
                 vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
                 ::front(&this->m_listen_interfaces);
        local_430 = pvVar4->port;
      }
      ep.ssl = (undefined1)local_430;
      ep.flags.m_val = local_430._1_1_;
      ep._106_2_ = local_430._2_2_;
      boost::asio::ip::address_v4::any();
      boost::asio::ip::address::address(&local_e0,&local_e4);
      p = ep._104_4_;
      ::std::__cxx11::string::string((string *)&local_108);
      this_00 = &ifs.
                 super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      boost::asio::ip::address::address((address *)this_00);
      listen_endpoint_t::listen_endpoint_t
                ((listen_endpoint_t *)local_c0,&local_e0,p,&local_108,plaintext,
                 (listen_socket_flags_t)0x8,(address *)this_00);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::
      vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
      ::emplace_back<libtorrent::aux::listen_endpoint_t&>
                ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                  *)local_40,(listen_endpoint_t *)local_c0);
      this->m_listen_socket_version = this->m_listen_socket_version + 1;
      listen_endpoint_t::~listen_endpoint_t((listen_endpoint_t *)local_c0);
    }
    local_1e8._8_8_ =
         partition_listen_sockets
                   ((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                     *)local_40,&this->m_listen_sockets);
    local_1e8._0_8_ =
         ::std::
         vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
         ::end(&this->m_listen_sockets);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                        *)(local_1e8 + 8),
                       (__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                        *)local_1e8);
    local_471 = 1;
    if (!bVar1) {
      bVar1 = ::std::
              vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
              ::empty((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                       *)local_40);
      local_471 = bVar1 ^ 0xff;
    }
    if ((local_471 & 1) != 0) {
      this->m_listen_socket_version = this->m_listen_socket_version + 1;
    }
    while( true ) {
      local_1f0._M_current =
           (shared_ptr<libtorrent::aux::listen_socket_t> *)
           ::std::
           vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ::end(&this->m_listen_sockets);
      __rhs = &local_1f0;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                          *)(local_1e8 + 8),__rhs);
      iVar2 = (int)__rhs;
      if (!bVar1) break;
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
      if (bVar1) {
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_dht);
        psVar5 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                 ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                              *)(local_1e8 + 8));
        ::std::shared_ptr<libtorrent::aux::listen_socket_t>::shared_ptr(&local_210,psVar5);
        listen_socket_handle::listen_socket_handle(&local_200,&local_210);
        s_00 = &local_200;
        libtorrent::dht::dht_tracker::delete_socket(peVar11,s_00);
        iVar2 = (int)s_00;
        listen_socket_handle::~listen_socket_handle(&local_200);
        ::std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr(&local_210);
      }
      bVar1 = should_log(this);
      if (bVar1) {
        p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  *)(local_1e8 + 8));
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var16);
        print_endpoint_abi_cxx11_(&local_230,(aux *)&peVar17->local_endpoint,ep_00);
        uVar6 = ::std::__cxx11::string::c_str();
        p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  *)(local_1e8 + 8));
        ::std::
        __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var16);
        uVar7 = ::std::__cxx11::string::c_str();
        iVar2 = 0x86f47e;
        session_log(this,"closing listen socket for %s on device \"%s\"",uVar6,uVar7);
        ::std::__cxx11::string::~string((string *)&local_230);
      }
      p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                   ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                *)(local_1e8 + 8));
      peVar17 = ::std::
                __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var16);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->sock);
      if (bVar1) {
        p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  *)(local_1e8 + 8));
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var16);
        peVar14 = ::std::
                  __shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar17->sock);
        iVar2 = (int)&eps + 0x10;
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::close(peVar14,iVar2);
      }
      p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                   ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                *)(local_1e8 + 8));
      peVar17 = ::std::
                __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var16);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->udp_sock);
      if (bVar1) {
        p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  *)(local_1e8 + 8));
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var16);
        peVar15 = ::std::
                  __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar17->udp_sock);
        udp_socket::close(&peVar15->sock,iVar2);
      }
      p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                   ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                *)(local_1e8 + 8));
      peVar17 = ::std::
                __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var16);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->natpmp_mapper);
      if (bVar1) {
        p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  *)(local_1e8 + 8));
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var16);
        this_02 = ::std::
                  __shared_ptr_access<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar17->natpmp_mapper);
        natpmp::close(this_02,iVar2);
      }
      p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                   ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                *)(local_1e8 + 8));
      peVar17 = ::std::
                __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var16);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->upnp_mapper);
      if (bVar1) {
        p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  *)(local_1e8 + 8));
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var16);
        this_03 = ::std::
                  __shared_ptr_access<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar17->upnp_mapper);
        upnp::close(this_03,iVar2);
      }
      p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                   ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                *)(local_1e8 + 8));
      peVar17 = ::std::
                __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var16);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->lsd);
      if (bVar1) {
        p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*((__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  *)(local_1e8 + 8));
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var16);
        this_04 = ::std::
                  __shared_ptr_access<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar17->lsd);
        lsd::close(this_04,iVar2);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>const*,std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>>
      ::__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>*>
                (a_Stack_240,
                 (__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                  *)(local_1e8 + 8));
      local_238 = ::std::
                  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                  ::erase(&this->m_listen_sockets,(const_iterator)_a_Stack_240);
      local_1e8._8_8_ = local_238;
    }
    this_07 = &this->m_listen_sockets;
    sVar8 = ::std::
            vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
            ::size(this_07);
    iVar9 = ::std::
            vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
            ::begin(this_07);
    iVar10 = ::std::
             vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ::end(this_07);
    bVar1 = ::std::
            any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>*,std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>>,libtorrent::aux::session_impl::reopen_listen_sockets(bool)::__0>
                      (iVar9._M_current,iVar10._M_current);
    counters::set_value(&this->m_stats_counters,0x116,(ulong)bVar1);
    __end2 = ::std::
             vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             ::begin((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                      *)local_40);
    ep_1 = (listen_endpoint_t *)
           ::std::
           vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
           ::end((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                  *)local_40);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
                                       *)&ep_1), bVar1) {
      s.super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               __gnu_cxx::
               __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
               ::operator*(&__end2);
      setup_listener((session_impl *)local_290,(listen_endpoint_t *)this,
                     (error_code *)
                     s.
                     super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
      bVar1 = boost::system::error_code::operator_cast_to_bool
                        ((error_code *)
                         &eps.
                          super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) {
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_290);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->sock);
        if (!bVar1) {
          peVar17 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_290);
          bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->udp_sock);
          if (!bVar1) goto LAB_005878a0;
        }
        ::std::
        vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>
        ::emplace_back<std::shared_ptr<libtorrent::aux::listen_socket_t>&>
                  ((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>
                    *)&this->m_listen_sockets,
                   (shared_ptr<libtorrent::aux::listen_socket_t> *)local_290);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
        local_4c1 = 0;
        if (bVar1) {
          peVar17 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_290);
          local_4c1 = 0;
          if (peVar17->ssl != ssl) {
            peVar17 = ::std::
                      __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_290);
            local_292 = (peVar17->flags).m_val;
            local_293 = 2;
            local_291 = (bitfield_flag)
                        libtorrent::flags::operator&
                                  ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                    )local_292,
                                   (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                    )0x2);
            bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_291);
            local_4c1 = bVar1 ^ 0xff;
          }
        }
        if ((local_4c1 & 1) != 0) {
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_dht);
          pvVar12 = ::std::
                    vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                    ::back(&this->m_listen_sockets);
          ::std::shared_ptr<libtorrent::aux::listen_socket_t>::shared_ptr
                    ((shared_ptr<libtorrent::aux::listen_socket_t> *)&e,pvVar12);
          listen_socket_handle::listen_socket_handle
                    (&local_2a8,(shared_ptr<libtorrent::aux::listen_socket_t> *)&e);
          libtorrent::dht::dht_tracker::new_socket(peVar11,&local_2a8);
          listen_socket_handle::~listen_socket_handle(&local_2a8);
          ::std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr
                    ((shared_ptr<libtorrent::aux::listen_socket_t> *)&e);
        }
        peVar17 = ::std::
                  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_290);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->sock);
        if (bVar1) {
          peVar17 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_290);
          peVar13 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_290);
          async_accept(this,&peVar17->sock,peVar13->ssl);
        }
      }
LAB_005878a0:
      ::std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr
                ((shared_ptr<libtorrent::aux::listen_socket_t> *)local_290);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
      ::operator++(&__end2);
    }
    bVar1 = ::std::
            vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
            ::empty(&this->m_listen_sockets);
    if (bVar1) {
      session_log(this,"giving up on binding listen sockets");
      new_sockets.m_len._4_4_ = 1;
    }
    else {
      span<std::shared_ptr<libtorrent::aux::listen_socket_t>>::
      span<std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>,std::shared_ptr<libtorrent::aux::listen_socket_t>,void>
                ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>> *)&__range3_1,
                 &this->m_listen_sockets);
      sVar19 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::subspan
                         ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)&__range3_1,
                          (long)(int)sVar8);
      new_sockets.m_ptr = (shared_ptr<libtorrent::aux::listen_socket_t> *)sVar19.m_len;
      local_2f8 = (undefined1  [8])sVar19.m_ptr;
      bVar1 = alert_manager::should_post<libtorrent::listen_succeeded_alert>(&this->m_alerts);
      if (bVar1) {
        __end3_1 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::begin
                             ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8)
        ;
        psVar18 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::end
                            ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8);
        for (; __end3_1 != psVar18; __end3_1 = __end3_1 + 1) {
          boost::system::error_code::error_code
                    ((error_code *)((long)&tcp_ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
          peVar17 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)__end3_1);
          bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->sock);
          if (bVar1) {
            peVar17 = ::std::
                      __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)__end3_1);
            peVar14 = ::std::
                      __shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar17->sock);
            boost::asio::
            basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::local_endpoint((endpoint_type *)((long)&udp_ep.impl_.data_ + 0x18),peVar14,
                             (error_code *)((long)&tcp_ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
            bVar1 = boost::system::error_code::operator_cast_to_bool
                              ((error_code *)((long)&tcp_ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc))
            ;
            if (!bVar1) {
              peVar17 = ::std::
                        __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)__end3_1);
              udp_ep.impl_.data_._23_1_ = 0;
              if (peVar17->ssl == ssl) {
                udp_ep.impl_.data_._23_1_ = 6;
              }
              alert_manager::
              emplace_alert<libtorrent::listen_succeeded_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::socket_type_t_const&>
                        (&this->m_alerts,
                         (basic_endpoint<boost::asio::ip::tcp> *)((long)&udp_ep.impl_.data_ + 0x18),
                         (socket_type_t *)((long)&udp_ep.impl_.data_ + 0x17));
            }
          }
          peVar17 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)__end3_1);
          bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar17->udp_sock);
          if (bVar1) {
            peVar17 = ::std::
                      __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)__end3_1);
            peVar15 = ::std::
                      __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar17->udp_sock);
            udp_socket::local_endpoint
                      ((endpoint *)((long)&__range3_2 + 4),&peVar15->sock,
                       (error_code *)((long)&tcp_ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
            bVar1 = boost::system::error_code::operator_cast_to_bool
                              ((error_code *)((long)&tcp_ep.impl_.data_.v6.sin6_addr.__in6_u + 0xc))
            ;
            if (!bVar1) {
              peVar17 = ::std::
                        __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)__end3_1);
              peVar15 = ::std::
                        __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&peVar17->udp_sock);
              bVar1 = udp_socket::is_open(&peVar15->sock);
              if (bVar1) {
                peVar17 = ::std::
                          __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)__end3_1);
                __range3_2._3_1_ = 3;
                if (peVar17->ssl == ssl) {
                  __range3_2._3_1_ = 9;
                }
                alert_manager::
                emplace_alert<libtorrent::listen_succeeded_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::socket_type_t_const&>
                          (&this->m_alerts,
                           (basic_endpoint<boost::asio::ip::udp> *)((long)&__range3_2 + 4),
                           (socket_type_t *)((long)&__range3_2 + 3));
              }
            }
          }
        }
      }
      iVar2 = session_settings::get_int(&this->m_settings,0x4028);
      if (iVar2 != 0) {
        update_peer_dscp(this);
      }
      boost::system::error_code::clear
                ((error_code *)
                 &eps.
                  super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = session_settings::get_bool(&this->m_settings,0x803c);
      if (bVar1) {
        __end3_2 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::begin
                             ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8)
        ;
        psVar18 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::end
                            ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8);
        for (; __end3_2 != psVar18; __end3_2 = __end3_2 + 1) {
          start_natpmp(this,__end3_2);
        }
      }
      bVar1 = session_settings::get_bool(&this->m_settings,0x803b);
      if (bVar1) {
        __end3_3 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::begin
                             ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8)
        ;
        psVar18 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::end
                            ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8);
        for (; __end3_3 != psVar18; __end3_3 = __end3_3 + 1) {
          start_upnp(this,__end3_3);
        }
      }
      if (map_ports) {
        __end3_4 = ::std::
                   vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                   ::begin(&this->m_listen_sockets);
        s_3 = (shared_ptr<libtorrent::aux::listen_socket_t> *)
              ::std::
              vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
              ::end(&this->m_listen_sockets);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_4,
                                  (__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                   *)&s_3), bVar1) {
          p_Var16 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                       ::operator*(&__end3_4);
          peVar17 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*(p_Var16);
          remap_ports(this,remap_natpmp_and_upnp,peVar17);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
          ::operator++(&__end3_4);
        }
      }
      else {
        __end3_5 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::begin
                             ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8)
        ;
        psVar18 = span<std::shared_ptr<libtorrent::aux::listen_socket_t>_>::end
                            ((span<std::shared_ptr<libtorrent::aux::listen_socket_t>_> *)local_2f8);
        for (; __end3_5 != psVar18; __end3_5 = __end3_5 + 1) {
          peVar17 = ::std::
                    __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)__end3_5);
          remap_ports(this,remap_natpmp_and_upnp,peVar17);
        }
      }
      update_lsd(this);
      open_new_incoming_i2p_connection(this);
      __end2_1 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
      t = (shared_ptr<libtorrent::aux::torrent> *)
          torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                 *)&t), bVar1) {
        this_05 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                     ::operator*(&__end2_1);
        this_06 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_05);
        torrent::enable_all_trackers(this_06);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
        ::operator++(&__end2_1);
      }
      new_sockets.m_len._4_4_ = 0;
    }
    ::std::
    vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
    ::~vector((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
               *)local_40);
  }
  return;
}

Assistant:

void session_impl::reopen_listen_sockets(bool const map_ports)
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("reopen listen sockets");
#endif

		TORRENT_ASSERT(is_single_thread());

		TORRENT_ASSERT(!m_abort);

		error_code ec;

		if (m_abort) return;

		// first build a list of endpoints we should be listening on
		// we need to remove any unneeded sockets first to avoid the possibility
		// of a new socket failing to bind due to a conflict with a stale socket
		std::vector<listen_endpoint_t> eps;

		// if we don't proxy peer connections, don't apply the special logic for
		// proxies
		if (m_settings.get_int(settings_pack::proxy_type) != settings_pack::none
			&& m_settings.get_bool(settings_pack::proxy_peer_connections))
		{
			// we will be able to accept incoming connections over UDP. so use
			// one of the ports the user specified to use a consistent port
			// across sessions. If the user did not specify any ports, pick one
			// at random
			int const port = m_listen_interfaces.empty()
				? int(random(63000) + 2000)
				: m_listen_interfaces.front().port;
			listen_endpoint_t ep(address_v4::any(), port, {}
				, transport::plaintext, listen_socket_t::proxy);
			eps.emplace_back(ep);
			++m_listen_socket_version;
		}
		else
		{
			std::vector<ip_interface> const ifs = enum_net_interfaces(m_io_context, ec);
			if (ec && m_alerts.should_post<listen_failed_alert>())
			{
				m_alerts.emplace_alert<listen_failed_alert>(""
					, operation_t::enum_if, ec, socket_type_t::tcp);
			}
			auto const routes = enum_routes(m_io_context, ec);
			if (ec && m_alerts.should_post<listen_failed_alert>())
			{
				m_alerts.emplace_alert<listen_failed_alert>(""
					, operation_t::enum_route, ec, socket_type_t::tcp);
			}

			// expand device names and populate eps
			for (auto const& iface : m_listen_interfaces)
			{
#if !TORRENT_USE_SSL
				if (iface.ssl)
				{
#ifndef TORRENT_DISABLE_LOGGING
					session_log("attempted to listen ssl with no library support on device: \"%s\""
						, iface.device.c_str());
#endif
					if (m_alerts.should_post<listen_failed_alert>())
					{
						m_alerts.emplace_alert<listen_failed_alert>(iface.device
							, operation_t::sock_open
							, boost::asio::error::operation_not_supported
							, socket_type_t::tcp_ssl);
					}
					continue;
				}
#endif

				// now we have a device to bind to. This device may actually just be an
				// IP address or a device name. In case it's a device name, we want to
				// (potentially) end up binding a socket for each IP address associated
				// with that device.
				interface_to_endpoints(iface, listen_socket_t::accept_incoming, ifs, eps);
			}

			if (eps.empty())
			{
#ifndef TORRENT_DISABLE_LOGGING
				session_log("no listen sockets");
#endif
			}

#if defined TORRENT_ANDROID && __ANDROID_API__ >= 24
			// For Android API >= 24, enum_routes with the current NETLINK based
			// implementation is unsupported (maybe in the future the operation
			// will be restore using another implementation). If routes is empty,
			// allow using unspecified address is a best effort approach that
			// seems to work. The issue with this approach is with the DHTs,
			// because for IPv6 this is not following BEP 32 and BEP 45. See:
			// https://www.bittorrent.org/beps/bep_0032.html
			// https://www.bittorrent.org/beps/bep_0045.html
			if (!routes.empty()) expand_unspecified_address(ifs, routes, eps);
#else
			expand_unspecified_address(ifs, routes, eps);
#endif
			expand_devices(ifs, eps);
		}

		auto remove_iter = partition_listen_sockets(eps, m_listen_sockets);

		if (remove_iter != m_listen_sockets.end() || !eps.empty())
			++m_listen_socket_version;

		while (remove_iter != m_listen_sockets.end())
		{
#ifndef TORRENT_DISABLE_DHT
			if (m_dht)
				m_dht->delete_socket(*remove_iter);
#endif

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("closing listen socket for %s on device \"%s\""
					, print_endpoint((*remove_iter)->local_endpoint).c_str()
					, (*remove_iter)->device.c_str());
			}
#endif
			if ((*remove_iter)->sock) (*remove_iter)->sock->close(ec);
			if ((*remove_iter)->udp_sock) (*remove_iter)->udp_sock->sock.close();
			if ((*remove_iter)->natpmp_mapper) (*remove_iter)->natpmp_mapper->close();
			if ((*remove_iter)->upnp_mapper) (*remove_iter)->upnp_mapper->close();
			if ((*remove_iter)->lsd) (*remove_iter)->lsd->close();
			remove_iter = m_listen_sockets.erase(remove_iter);
		}

		// all sockets in there stayed the same. Only sockets after this point are
		// new and should post alerts
		int const existing_sockets = int(m_listen_sockets.size());

		m_stats_counters.set_value(counters::has_incoming_connections
			, std::any_of(m_listen_sockets.begin(), m_listen_sockets.end()
				, [](std::shared_ptr<listen_socket_t> const& l)
				{ return l->incoming_connection; }));

		// open new sockets on any endpoints that didn't match with
		// an existing socket
		for (auto const& ep : eps)
#ifndef BOOST_NO_EXCEPTIONS
			try
#endif
		{
			std::shared_ptr<listen_socket_t> s = setup_listener(ep, ec);

			if (!ec && (s->sock || s->udp_sock))
			{
				m_listen_sockets.emplace_back(s);

#ifndef TORRENT_DISABLE_DHT
				if (m_dht
					&& s->ssl != transport::ssl
					&& !(s->flags & listen_socket_t::local_network))
				{
					m_dht->new_socket(m_listen_sockets.back());
				}
#endif

				TORRENT_ASSERT(bool(s->flags & listen_socket_t::accept_incoming) == bool(s->sock));
				if (s->sock) async_accept(s->sock, s->ssl);
			}
		}
#ifndef BOOST_NO_EXCEPTIONS
		catch (std::exception const& e)
		{
			TORRENT_UNUSED(e);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("setup_listener(%s) device: %s failed: %s"
					, print_endpoint(ep.addr, ep.port).c_str()
					, ep.device.c_str()
					, e.what());
			}
#endif // TORRENT_DISABLE_LOGGING
		}
#endif // BOOST_NO_EXCEPTIONS

		if (m_listen_sockets.empty())
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("giving up on binding listen sockets");
#endif
			return;
		}

		auto const new_sockets = span<std::shared_ptr<listen_socket_t>>(
			m_listen_sockets).subspan(existing_sockets);

		// now, send out listen_succeeded_alert for the listen sockets we are
		// listening on
		if (m_alerts.should_post<listen_succeeded_alert>())
		{
			for (auto const& l : new_sockets)
			{
				error_code err;
				if (l->sock)
				{
					tcp::endpoint const tcp_ep = l->sock->local_endpoint(err);
					if (!err)
					{
						socket_type_t const socket_type
							= l->ssl == transport::ssl
							? socket_type_t::tcp_ssl
							: socket_type_t::tcp;

						m_alerts.emplace_alert<listen_succeeded_alert>(
							tcp_ep, socket_type);
					}
				}

				if (l->udp_sock)
				{
					udp::endpoint const udp_ep = l->udp_sock->sock.local_endpoint(err);
					if (!err && l->udp_sock->sock.is_open())
					{
						socket_type_t const socket_type
							= l->ssl == transport::ssl
							? socket_type_t::utp_ssl
							: socket_type_t::utp;

						m_alerts.emplace_alert<listen_succeeded_alert>(
							udp_ep, socket_type);
					}
				}
			}
		}

		if (m_settings.get_int(settings_pack::peer_dscp) != 0)
		{
			update_peer_dscp();
		}

		ec.clear();

		if (m_settings.get_bool(settings_pack::enable_natpmp))
		{
			for (auto const& s : new_sockets)
				start_natpmp(s);
		}

		if (m_settings.get_bool(settings_pack::enable_upnp))
		{
			for (auto const& s : new_sockets)
				start_upnp(s);
		}

		if (map_ports)
		{
			for (auto const& s : m_listen_sockets)
				remap_ports(remap_natpmp_and_upnp, *s);
		}
		else
		{
			// new sockets need to map ports even if the caller did not request
			// re-mapping
			for (auto const& s : new_sockets)
				remap_ports(remap_natpmp_and_upnp, *s);
		}

		update_lsd();

#if TORRENT_USE_I2P
		open_new_incoming_i2p_connection();
#endif

		// trackers that were not reachable, may have become reachable now.
		// so clear the "disabled" flags to let them be tried one more time
		// TODO: it would probably be better to do this by having a
		// listen-socket "version" number that gets bumped. And instead of
		// setting a bool to disable a tracker, we set the version number that
		// it was disabled at. This change would affect the ABI in 1.2, so
		// should be done in 2.0 or later
		for (auto& t : m_torrents)
			t->enable_all_trackers();
	}